

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Line::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Line *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  pointer ppSVar2;
  MthdSolidFormat *pMVar3;
  SingleMthdTest *pSVar4;
  result_type rVar5;
  MthdCtxPattern *this_01;
  MthdOperation *this_02;
  MthdVtxXy *pMVar6;
  Test *pTVar7;
  MthdCtxSurf *this_03;
  MthdCtxSurf2D *this_04;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_499;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *local_498
  ;
  undefined1 local_490 [32];
  Test *local_470;
  Test *local_468;
  Test *local_460;
  MthdVtxXy *local_458;
  Test *local_450;
  MthdSolidFormat *local_448;
  Test *local_440;
  Test *local_438;
  Test *local_430;
  Test *local_428;
  Test *local_420;
  Test *local_418;
  Test *local_410;
  Test *local_408;
  SingleMthdTest *local_400;
  Test *local_3f8;
  MthdCtxSurf2D *local_3f0;
  undefined1 local_3e8 [56];
  undefined1 *local_3b0;
  unsigned_long local_3a8;
  undefined1 local_3a0 [16];
  undefined1 *local_390;
  unsigned_long local_388;
  undefined1 local_380 [16];
  undefined1 *local_370;
  unsigned_long local_368;
  undefined1 local_360 [16];
  undefined1 *local_350;
  unsigned_long local_348;
  undefined1 local_340 [16];
  undefined1 *local_330;
  unsigned_long local_328;
  undefined1 local_320 [16];
  undefined1 *local_310;
  unsigned_long local_308;
  undefined1 local_300 [16];
  undefined1 *local_2f0;
  unsigned_long local_2e8;
  undefined1 local_2e0 [16];
  undefined1 *local_2d0;
  unsigned_long local_2c8;
  undefined1 local_2c0 [16];
  undefined1 *local_2b0;
  unsigned_long local_2a8;
  undefined1 local_2a0 [16];
  undefined1 *local_290;
  unsigned_long local_288;
  undefined1 local_280 [16];
  undefined1 *local_270;
  unsigned_long local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  unsigned_long local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  unsigned_long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  unsigned_long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  unsigned_long local_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  Test *local_f0;
  Test *local_e8;
  MthdCtxPattern *local_e0;
  Test *local_d8;
  Test *local_d0;
  Test *local_c8;
  MthdOperation *local_c0;
  MthdSolidFormat *local_b8;
  Test *local_b0;
  MthdVtxXy *local_a8;
  MthdVtxXy *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  MthdVtxXy *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  MthdVtxXy *local_58;
  string local_50;
  
  local_498 = (vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
               *)__return_storage_ptr__;
  local_400 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_490._0_8_ = local_490 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"nop","");
  pSVar4 = local_400;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_400,opt,(uint32_t)rVar5);
  (pSVar4->super_MthdTest).trapbit = -1;
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar4->s_cls = uVar1;
  pSVar4->s_mthd = 0x100;
  pSVar4->s_stride = 4;
  pSVar4->s_num = 1;
  pSVar4->s_trapbit = -1;
  (pSVar4->name)._M_dataplus._M_p = (pointer)&(pSVar4->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar4->name,local_490._0_8_,(pointer)(local_490._0_8_ + local_490._8_8_));
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_110._0_8_ = pSVar4;
  local_408 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3f8 = (Test *)local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"notify","");
  pTVar7 = local_408;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_408,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_3f8,
             (long)&(local_3f0->super_SingleMthdTest).super_MthdTest.super_StateTest.
                    super_RepeatTest + (long)&(local_3f8 + 0x1e)[-0x1e]._vptr_Test);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_110._8_8_ = pTVar7;
  local_410 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"patch","");
  pTVar7 = local_410;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_410,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x10c;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_1f0,local_1f0 + local_1e8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349758;
  local_110._16_8_ = pTVar7;
  local_418 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"pm_trigger","");
  pTVar7 = local_418;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_418,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_210,local_210 + local_208);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_110._24_8_ = pTVar7;
  local_420 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"dma_notify","");
  pTVar7 = local_420;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_420,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 1;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_230,local_230 + local_228);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_f0 = pTVar7;
  local_428 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"ctx_clip","");
  pTVar7 = local_428;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_428,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x184;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 2;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_250,local_250 + local_248);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349948;
  local_e8 = pTVar7;
  this_01 = (MthdCtxPattern *)operator_new(0x25958);
  local_3e8._48_8_ = this_01;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ctx_pattern","");
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern(this_01,opt,(uint32_t)rVar5,&local_130,3,uVar1,0x188,uVar1 != 0x1c)
  ;
  local_e0 = this_01;
  local_430 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"ctx_rop","");
  pTVar7 = local_430;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_430,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 4;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_270,local_270 + local_268);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349a40;
  local_d8 = pTVar7;
  local_438 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"ctx_beta","");
  pTVar7 = local_438;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_438,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 400;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 5;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_290,local_290 + local_288);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349b38;
  local_d0 = pTVar7;
  local_440 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"missing","");
  pTVar7 = local_440;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_440,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_2b0,local_2b0 + local_2a8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  local_c8 = pTVar7;
  this_02 = (MthdOperation *)operator_new(0x25958);
  local_3e8._40_8_ = this_02;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"operation","");
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation(this_02,opt,(uint32_t)rVar5,&local_150,8,uVar1,0x2fc,uVar1 != 0x1c);
  local_c0 = this_02;
  local_448 = (MthdSolidFormat *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"format","");
  pMVar3 = local_448;
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (local_448,opt,(uint32_t)rVar5,&local_170,9,uVar1,0x300,uVar1 != 0x1c);
  local_b8 = pMVar3;
  local_450 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"color","");
  pTVar7 = local_450;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_450,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_2d0,local_2d0 + local_2c8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c700;
  local_b0 = pTVar7;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  local_3e8._32_8_ = pMVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"line.0.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar5,&local_190,0xb,(this->super_Class).cls,0x400,0x10,8,1);
  local_a8 = pMVar6;
  local_458 = (MthdVtxXy *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"line.1.xy","");
  pMVar6 = local_458;
  MthdVtxXy::MthdVtxXy
            (local_458,opt,(uint32_t)rVar5,&local_1b0,0xc,(this->super_Class).cls,0x404,0x10,8,4);
  local_a0 = pMVar6;
  pTVar7 = (Test *)operator_new(0x25958);
  local_3e8._24_8_ = pTVar7;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"line32.0.x","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x480;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 0x10;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_2f0,local_2f0 + local_2e8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349e80;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  local_98 = pTVar7;
  local_460 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_310 = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"line32.0.y","");
  pTVar7 = local_460;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_460,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x484;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 0x10;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xe;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_310,local_310 + local_308);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349f78;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_90 = pTVar7;
  local_468 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"line32.1.x","");
  pTVar7 = local_468;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_468,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x488;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 0x10;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_330,local_330 + local_328);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349e80;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_88 = pTVar7;
  local_470 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_350 = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"line32.1.y","");
  pTVar7 = local_470;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_470,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x48c;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 0x10;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_350,local_350 + local_348);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349f78;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0x100;
  local_80 = pTVar7;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  local_3e8._16_8_ = pMVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"polyline.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar5,&local_1d0,0x11,(this->super_Class).cls,0x500,0x20,4,6);
  local_78 = pMVar6;
  pTVar7 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_370 = local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"polyline32.x","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x580;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x12;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_370,local_370 + local_368);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349e80;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0x100;
  local_70 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_390 = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"polyline32.y","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x584;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x13;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_390,local_390 + local_388);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349f78;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0x101;
  local_68 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3b0 = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"cpolyline.color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x600;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x14;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_3b0,local_3b0 + local_3a8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c700;
  local_60 = pTVar7;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cpolyline.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar5,&local_50,0x15,(this->super_Class).cls,0x604,0x10,8,6);
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_110;
  local_58 = pMVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector((vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_498,__l,&local_499);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_390 != local_380) {
    operator_delete(local_390);
  }
  if (local_370 != local_360) {
    operator_delete(local_370);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  if (local_330 != local_320) {
    operator_delete(local_330);
  }
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_3f8 != (Test *)local_3e8) {
    operator_delete(local_3f8);
  }
  if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
    operator_delete((void *)local_490._0_8_);
  }
  ppSVar2 = *(pointer *)(local_498 + 8);
  if ((this->super_Class).cls == 0x1c) {
    this_03 = (MthdCtxSurf *)operator_new(0x25958);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_110._0_8_ = (SingleMthdTest *)(local_110 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ctx_dst","");
    MthdCtxSurf::MthdCtxSurf
              (this_03,opt,(uint32_t)rVar5,(string *)local_110,7,(this->super_Class).cls,0x194,0);
    local_490._0_8_ = this_03;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_498,ppSVar2,local_490);
    if ((SingleMthdTest *)local_110._0_8_ == (SingleMthdTest *)(local_110 + 0x10)) {
      return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              *)local_498;
    }
  }
  else {
    pTVar7 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_110._0_8_ = (SingleMthdTest *)(local_110 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ctx_beta4","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar7,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 6;
    pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_110._0_8_,
               (pointer)(local_110._0_8_ + (long)((mt19937 *)(local_110._8_8_ + 8) + -1) + 0x1380));
    pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349c30;
    local_3f8 = pTVar7;
    this_04 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_490._0_8_ = local_490 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"ctx_surf2d","");
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_04,opt,(uint32_t)rVar5,(string *)local_490,7,(this->super_Class).cls,0x198,1);
    local_3f0 = this_04;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_498,ppSVar2,&local_3f8);
    if ((MthdCtxSurf *)local_490._0_8_ != (MthdCtxSurf *)(local_490 + 0x10)) {
      operator_delete((void *)local_490._0_8_);
    }
    if ((SingleMthdTest *)local_110._0_8_ == (SingleMthdTest *)(local_110 + 0x10)) {
      return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              *)local_498;
    }
  }
  operator_delete((void *)local_110._0_8_);
  return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_498;
}

Assistant:

std::vector<SingleMthdTest *> Line::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1c),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1c),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1c),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "line.0.xy", 11, cls, 0x400, 0x10, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "line.1.xy", 12, cls, 0x404, 0x10, 8, VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "line32.0.x", 13, cls, 0x480, 8, 0x10, VTX_FIRST),
		new MthdVtxY32(opt, rnd(), "line32.0.y", 14, cls, 0x484, 8, 0x10, VTX_FIRST),
		new MthdVtxX32(opt, rnd(), "line32.1.x", 15, cls, 0x488, 8, 0x10, VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "line32.1.y", 16, cls, 0x48c, 8, 0x10, VTX_DRAW),
		new MthdVtxXy(opt, rnd(), "polyline.xy", 17, cls, 0x500, 0x20, 4, VTX_POLY | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "polyline32.x", 18, cls, 0x580, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "polyline32.y", 19, cls, 0x584, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpolyline.color", 20, cls, 0x600, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpolyline.xy", 21, cls, 0x604, 0x10, 8, VTX_POLY | VTX_DRAW),
	};
	if (cls == 0x1c) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}